

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_for::run_impl(statement_for *this)

{
  bool bVar1;
  stack_pointer psVar2;
  _Elt_pointer ppsVar3;
  statement_base *psVar4;
  undefined *puVar5;
  bool *pbVar6;
  _Elt_pointer ptVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  _Elt_pointer ppsVar11;
  element_type *peVar12;
  stack_pointer psVar13;
  _Elt_pointer ppsVar14;
  _Map_pointer pppsVar15;
  scope_guard scope;
  scope_guard top_scope;
  tree_node *local_c0;
  slot_type *local_b8;
  scope_guard local_b0;
  scope_guard local_a8;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_98;
  
  peVar12 = (((this->super_statement_base).context.
              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
            super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar12->break_block == true) {
    peVar12->break_block = false;
  }
  local_b8 = (slot_type *)&(this->super_statement_base).context;
  if (peVar12->continue_block == true) {
    peVar12->continue_block = false;
  }
  psVar2 = *(peVar12->super_runtime_type).storage.fiber_stack;
  psVar13 = &(peVar12->super_runtime_type).storage.m_data;
  if (psVar2 != (stack_pointer)0x0) {
    psVar13 = psVar2;
  }
  local_a8.context = (context_t *)local_b8;
  stack_type<cs::domain_type,_std::allocator>::push<>(psVar13);
  ptVar7 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar9 = (long)ptVar7 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
  uVar8 = lVar9 >> 3;
  if ((long)uVar8 < 0) {
    uVar10 = lVar9 >> 9;
  }
  else {
    if (uVar8 < 0x40) goto LAB_002ac9c8;
    uVar10 = uVar8 >> 6;
  }
  ptVar7 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar8 + uVar10 * -0x40;
LAB_002ac9c8:
  instance_type::parse_define_var
            ((((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ptVar7->mRoot,
             false,false);
  local_b0.context = (context_t *)local_b8;
  peVar12 = (((element_type *)(local_b8->value).first._M_dataplus._M_p)->instance).
            super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar2 = *(peVar12->super_runtime_type).storage.fiber_stack;
  psVar13 = &(peVar12->super_runtime_type).storage.m_data;
  if (psVar2 != (stack_pointer)0x0) {
    psVar13 = psVar2;
  }
  stack_type<cs::domain_type,_std::allocator>::push<>(psVar13);
  do {
    puVar5 = current_process;
    if ((*current_process & 1) != 0) {
      LOCK();
      *current_process = 0;
      UNLOCK();
      event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
    }
    ptVar7 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar9 = (long)ptVar7 -
            (long)(this->mParallel).
                  super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
    uVar8 = lVar9 + 1;
    if (lVar9 < -1) {
      uVar10 = (long)uVar8 >> 6;
LAB_002aca5f:
      ptVar7 = (this->mParallel).
               super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar8 + uVar10 * -0x40;
    }
    else {
      if (0x3f < uVar8) {
        uVar10 = uVar8 >> 6;
        goto LAB_002aca5f;
      }
      ptVar7 = ptVar7 + 1;
    }
    local_98.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )ptVar7->mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&local_c0,
               (iterator *)
               (((this->super_statement_base).context.
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance)
               .super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&stack0xffffffffffffff68,0));
    pbVar6 = cs_impl::any::const_val<bool>((any *)&local_c0);
    bVar1 = *pbVar6;
    cs_impl::any::recycle((any *)&local_c0);
    if (bVar1 == false) {
LAB_002acc05:
      scope_guard::~scope_guard(&local_b0);
      scope_guard::~scope_guard(&local_a8);
      return;
    }
    ppsVar14 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar3 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar14 == ppsVar3) {
      peVar12 = (((element_type *)(local_b8->value).first._M_dataplus._M_p)->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      ppsVar11 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar15 = (this->mBlock).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar5 = current_process;
        psVar4 = *ppsVar14;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
        }
        (*psVar4->_vptr_statement_base[3])(psVar4);
        peVar12 = (((element_type *)(local_b8->value).first._M_dataplus._M_p)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar12->return_fcall != false) goto LAB_002acc05;
        if (peVar12->break_block == true) {
          peVar12->break_block = false;
          goto LAB_002acc05;
        }
        if (peVar12->continue_block != false) {
          peVar12->continue_block = false;
          break;
        }
        ppsVar14 = ppsVar14 + 1;
        if (ppsVar14 == ppsVar11) {
          ppsVar14 = pppsVar15[1];
          pppsVar15 = pppsVar15 + 1;
          ppsVar11 = ppsVar14 + 0x40;
        }
      } while (ppsVar14 != ppsVar3);
    }
    ptVar7 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar9 = (long)ptVar7 -
            (long)(this->mParallel).
                  super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
    uVar8 = lVar9 + 2;
    if (lVar9 < -2) {
      uVar10 = (long)uVar8 >> 6;
LAB_002acbb5:
      ptVar7 = (this->mParallel).
               super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar8 + uVar10 * -0x40;
    }
    else {
      if (0x3f < uVar8) {
        uVar10 = uVar8 >> 6;
        goto LAB_002acbb5;
      }
      ptVar7 = ptVar7 + 2;
    }
    local_c0 = ptVar7->mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffff60,(iterator *)peVar12,SUB81(&local_c0,0));
    cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
    domain_manager::next_domain
              (&(((((element_type *)
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(local_b0.context)->
                     super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->_M_dataplus)
                   ._M_p)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
  } while( true );
}

Assistant:

void statement_for::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard top_scope(context);
		context->instance->parse_define_var(mParallel[0].root());
		scope_guard scope(context);
		while (true) {
			current_process->poll_event();
			if (!context->instance->parse_expr(mParallel[1].root()).const_val<boolean>())
				break;
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			context->instance->parse_expr(mParallel[2].root());
			scope.clear();
		}
	}